

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O1

void __thiscall
libcellml::Generator::GeneratorImpl::addExternNlaSolveMethodCode(GeneratorImpl *this)

{
  long *plVar1;
  Type TVar2;
  undefined8 *puVar3;
  char *pcVar4;
  ulong uVar5;
  undefined8 uVar6;
  bool bVar7;
  long *local_98;
  long local_88;
  undefined8 uStack_80;
  string local_78;
  ulong *local_58;
  long local_50;
  ulong local_48 [2];
  string local_38;
  
  TVar2 = AnalyserModel::type((this->mModel).
                              super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
  if ((TVar2 - DAE & 0xfffffffd) == 0) {
    GeneratorProfile::externNlaSolveMethodString_abi_cxx11_
              (&local_38,
               (this->mProfile).
               super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    bVar7 = local_38._M_string_length != 0;
  }
  else {
    bVar7 = false;
  }
  if (((TVar2 - DAE & 0xfffffffd) == 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2)) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (!bVar7) {
    return;
  }
  bVar7 = (this->mCode)._M_string_length != 0;
  pcVar4 = "";
  if (bVar7) {
    pcVar4 = "\n";
  }
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pcVar4,pcVar4 + bVar7);
  GeneratorProfile::externNlaSolveMethodString_abi_cxx11_
            (&local_78,
             (this->mProfile).
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  uVar5 = 0xf;
  if (local_58 != local_48) {
    uVar5 = local_48[0];
  }
  if (uVar5 < local_78._M_string_length + local_50) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      uVar6 = local_78.field_2._M_allocated_capacity;
    }
    if (local_78._M_string_length + local_50 <= (ulong)uVar6) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_58);
      goto LAB_001f4814;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_78._M_dataplus._M_p);
LAB_001f4814:
  local_98 = &local_88;
  plVar1 = puVar3 + 2;
  if ((long *)*puVar3 == plVar1) {
    local_88 = *plVar1;
    uStack_80 = puVar3[3];
  }
  else {
    local_88 = *plVar1;
    local_98 = (long *)*puVar3;
  }
  *puVar3 = plVar1;
  puVar3[1] = 0;
  *(undefined1 *)plVar1 = 0;
  std::__cxx11::string::_M_append((char *)&this->mCode,(ulong)local_98);
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return;
}

Assistant:

void Generator::GeneratorImpl::addExternNlaSolveMethodCode()
{
    if (modelHasNlas()
        && !mProfile->externNlaSolveMethodString().empty()) {
        mCode += newLineIfNeeded()
                 + mProfile->externNlaSolveMethodString();
    }
}